

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cpp
# Opt level: O2

void __thiscall cppcms::service::service(service *this,value *v)

{
  service *this_00;
  pointer __p;
  
  this_00 = (service *)operator_new(200);
  cppcms::impl::service::service(this_00);
  (this->impl_).ptr_ = this_00;
  __p = (pointer)operator_new(8);
  json::value::copyable::copyable((copyable *)__p,&v->d);
  std::__uniq_ptr_impl<cppcms::json::value,_std::default_delete<cppcms::json::value>_>::reset
            ((__uniq_ptr_impl<cppcms::json::value,_std::default_delete<cppcms::json::value>_> *)
             &this_00->settings_,__p);
  setup(this);
  return;
}

Assistant:

service::service(json::value const &v) :
	impl_(new impl::service())
{
	impl_->settings_.reset(new json::value(v));
	setup();
}